

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O0

JoypadStats joypad_get_stats(JoypadBuffer *buffer)

{
  JoypadStats JVar1;
  size_t overhead;
  JoypadChunk *cur;
  JoypadChunk *sentinel;
  JoypadBuffer *buffer_local;
  JoypadStats stats;
  
  memset(&buffer_local,0,0x10);
  for (overhead = (size_t)(buffer->sentinel).next; (JoypadBuffer *)overhead != buffer;
      overhead = *(size_t *)(overhead + 0x18)) {
    buffer_local = (JoypadBuffer *)
                   (&(buffer_local->last_buttons).down + *(long *)(overhead + 8) * 4);
    stats.used_bytes = *(long *)(overhead + 0x10) * 0x10 + 0x28 + stats.used_bytes;
  }
  JVar1.capacity_bytes = stats.used_bytes;
  JVar1.used_bytes = (size_t)buffer_local;
  return JVar1;
}

Assistant:

JoypadStats joypad_get_stats(JoypadBuffer* buffer) {
  JoypadStats stats;
  ZERO_MEMORY(stats);
  JoypadChunk* sentinel = &buffer->sentinel;
  JoypadChunk* cur = sentinel->next;
  while (cur != sentinel) {
    size_t overhead = sizeof(*cur);
    stats.used_bytes += cur->size * sizeof(JoypadState) + overhead;
    stats.capacity_bytes += cur->capacity * sizeof(JoypadState) + overhead;
    cur = cur->next;
  }
  return stats;
}